

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dacload.c
# Opt level: O0

int envy_bios_parse_dacload(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  envy_bios_dacload_entry *peVar5;
  envy_bios_dacload_entry *entry;
  int i;
  int wantrlen;
  int wanthlen;
  int err;
  envy_bios_dacload *dacload;
  envy_bios *bios_local;
  
  if ((bios->dacload).offset == 0) {
    bios_local._4_4_ = 0;
  }
  else {
    iVar1 = bios_u8(bios,(uint)(bios->dacload).offset,&(bios->dacload).version);
    iVar2 = bios_u8(bios,(bios->dacload).offset + 1,&(bios->dacload).hlen);
    iVar3 = bios_u8(bios,(bios->dacload).offset + 2,&(bios->dacload).rlen);
    iVar4 = bios_u8(bios,(bios->dacload).offset + 3,&(bios->dacload).entriesnum);
    if (iVar4 == 0 && (iVar3 == 0 && (iVar2 == 0 && iVar1 == 0))) {
      envy_bios_block(bios,(uint)(bios->dacload).offset,
                      (uint)(bios->dacload).hlen +
                      (uint)(bios->dacload).rlen * (uint)(bios->dacload).entriesnum,"DACLOAD",-1);
      if (((bios->dacload).version & 0xef) == 0) {
        if ((bios->dacload).hlen < 4) {
          fprintf(_stderr,"DACLOAD table header too short [%d < %d]\n",(ulong)(bios->dacload).hlen,4
                 );
          bios_local._4_4_ = -0x16;
        }
        else if ((bios->dacload).rlen < 4) {
          fprintf(_stderr,"DACLOAD table record too short [%d < %d]\n",(ulong)(bios->dacload).rlen,4
                 );
          bios_local._4_4_ = -0x16;
        }
        else {
          if (4 < (bios->dacload).hlen) {
            fprintf(_stderr,"DACLOAD table header longer than expected [%d > %d]\n",
                    (ulong)(bios->dacload).hlen,4);
          }
          if (4 < (bios->dacload).rlen) {
            fprintf(_stderr,"DACLOAD table record longer than expected [%d > %d]\n",
                    (ulong)(bios->dacload).rlen,4);
          }
          peVar5 = (envy_bios_dacload_entry *)calloc((ulong)(bios->dacload).entriesnum,8);
          (bios->dacload).entries = peVar5;
          if ((bios->dacload).entries == (envy_bios_dacload_entry *)0x0) {
            bios_local._4_4_ = -0xc;
          }
          else {
            for (entry._0_4_ = 0; (int)entry < (int)(uint)(bios->dacload).entriesnum;
                entry._0_4_ = (int)entry + 1) {
              peVar5 = (bios->dacload).entries + (int)entry;
              peVar5->offset =
                   (bios->dacload).offset + (ushort)(bios->dacload).hlen +
                   (ushort)(bios->dacload).rlen * (short)(int)entry;
              iVar1 = bios_u32(bios,(uint)peVar5->offset,&peVar5->val);
              if (iVar1 != 0) {
                return -0xe;
              }
            }
            (bios->dacload).valid = '\x01';
            bios_local._4_4_ = 0;
          }
        }
      }
      else {
        fprintf(_stderr,"Unknown DACLOAD table version %d.%d\n",
                (ulong)(uint)((int)(uint)(bios->dacload).version >> 4),
                (ulong)((bios->dacload).version & 0xf));
        bios_local._4_4_ = -0x16;
      }
    }
    else {
      bios_local._4_4_ = -0xe;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_dacload (struct envy_bios *bios) {
	struct envy_bios_dacload *dacload = &bios->dacload;
	if (!dacload->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, dacload->offset, &dacload->version);
	err |= bios_u8(bios, dacload->offset+1, &dacload->hlen);
	err |= bios_u8(bios, dacload->offset+2, &dacload->rlen);
	err |= bios_u8(bios, dacload->offset+3, &dacload->entriesnum);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, dacload->offset, dacload->hlen + dacload->rlen * dacload->entriesnum, "DACLOAD", -1);
	int wanthlen = 0;
	int wantrlen = 0;
	switch (dacload->version) {
		case 0x00:
		case 0x10:
			wanthlen = 4;
			wantrlen = 4;
			break;
		default:
			ENVY_BIOS_ERR("Unknown DACLOAD table version %d.%d\n", dacload->version >> 4, dacload->version & 0xf);
			return -EINVAL;
	}
	if (dacload->hlen < wanthlen) {
		ENVY_BIOS_ERR("DACLOAD table header too short [%d < %d]\n", dacload->hlen, wanthlen);
		return -EINVAL;
	}
	if (dacload->rlen < wantrlen) {
		ENVY_BIOS_ERR("DACLOAD table record too short [%d < %d]\n", dacload->rlen, wantrlen);
		return -EINVAL;
	}
	if (dacload->hlen > wanthlen) {
		ENVY_BIOS_WARN("DACLOAD table header longer than expected [%d > %d]\n", dacload->hlen, wanthlen);
	}
	if (dacload->rlen > wantrlen) {
		ENVY_BIOS_WARN("DACLOAD table record longer than expected [%d > %d]\n", dacload->rlen, wantrlen);
	}
	dacload->entries = calloc(dacload->entriesnum, sizeof *dacload->entries);
	if (!dacload->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < dacload->entriesnum; i++) {
		struct envy_bios_dacload_entry *entry = &dacload->entries[i];
		entry->offset = dacload->offset + dacload->hlen + dacload->rlen * i;
		err |= bios_u32(bios, entry->offset, &entry->val);
		if (err)
			return -EFAULT;
	}
	dacload->valid = 1;
	return 0;
}